

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocaleData::longLongToString
          (QLocaleData *this,qlonglong n,int precision,int base,int width,uint flags)

{
  long lVar1;
  undefined4 in_ECX;
  QStringView *in_RDX;
  QLocaleData *in_RSI;
  QString *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QStringView in_stack_00000010;
  bool negative;
  QString numStr;
  uint in_stack_000000d8;
  QString *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  QStringView *local_90;
  undefined1 negative_00;
  QLocaleData *this_00;
  
  negative_00 = (undefined1)((uint)in_ECX >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = in_RDX;
  if ((long)in_RDX < 0) {
    local_90 = (QStringView *)(1 - (long)((long)&in_RDX->m_data + 1));
  }
  this_00 = in_RSI;
  zeroDigit((QLocaleData *)CONCAT44(in_R8D,in_stack_ffffffffffffff58));
  QStringView::QStringView<QString,_true>(local_90,in_stack_ffffffffffffff48);
  qulltoa((qulonglong)in_RSI,(int)((ulong)in_RDI >> 0x20),in_stack_00000010);
  QString::~QString((QString *)0x13de3d);
  applyIntegerFormatting
            (this_00,(QString *)in_RDX,(bool)negative_00,in_R8D,numStr.d.size._4_4_,flags,
             in_stack_000000d8);
  QString::~QString((QString *)0x13de84);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocaleData::longLongToString(qlonglong n, int precision,
                                      int base, int width, unsigned flags) const
{
    bool negative = n < 0;

    /*
      Negating std::numeric_limits<qlonglong>::min() hits undefined behavior, so
      taking an absolute value has to take a slight detour.
     */
    QString numStr = qulltoa(negative ? 1u + qulonglong(-(n + 1)) : qulonglong(n),
                             base, zeroDigit());

    return applyIntegerFormatting(std::move(numStr), negative, precision, base, width, flags);
}